

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::EnumValueDescriptorProto::_InternalSerialize
          (EnumValueDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  EnumValueOptions *value;
  string_view s;
  EnumValueDescriptorProto *pEVar1;
  bool bVar2;
  int iVar3;
  int32_t value_00;
  uint32_t *puVar4;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  EnumValueDescriptorProto *pEStack_28;
  uint32_t cached_has_bits;
  EnumValueDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  EnumValueDescriptorProto *this_local;
  
  _s._4_4_ = 0;
  pEStack_28 = this;
  this_ = (EnumValueDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_name_abi_cxx11_(pEStack_28);
    data = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.EnumValueDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(data,iVar3,SERIALIZE,local_48);
    pEVar1 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pEVar1,1,s,(uint8_t *)stream_local);
  }
  pEVar1 = this_;
  if ((_s._4_4_ & 4) != 0) {
    value_00 = _internal_number(pEStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                             ((EpsCopyOutputStream *)pEVar1,value_00,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    value = (pEStack_28->field_0)._impl_.options_;
    iVar3 = EnumValueOptions::GetCachedSize((pEStack_28->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pEStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pEStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumValueDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumValueDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.EnumValueDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional int32 number = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_number(), target);
  }

  // optional .google.protobuf.EnumValueOptions options = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueDescriptorProto)
  return target;
}